

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

void __thiscall CoreML::ShapeRange::setValue(ShapeRange *this,size_t val)

{
  ostream *out;
  runtime_error *this_00;
  stringstream ss;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if ((((this->_minimum)._isUnbound == false) && ((this->_minimum)._val <= val)) &&
     (((this->_maximum)._isUnbound != false || (val <= (this->_maximum)._val)))) {
    (this->_minimum)._val = val;
    (this->_minimum)._isUnbound = false;
    (this->_maximum)._val = val;
    (this->_maximum)._isUnbound = false;
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Invalid setValue ",0x11);
  out = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(out," for range: ",0xc);
  ::operator<<(out,this);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ShapeRange::setValue(size_t val) {
    if (isValid(val)) {
        _minimum.set(val);
        _maximum.set(val);
    }
    else {
        std::stringstream ss;
        ss << "Invalid setValue " << val << " for range: " << *this << "\n";
        throw std::runtime_error(ss.str());
    }
}